

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t gnu_add_sparse_entry(archive_read *a,tar *tar,int64_t offset,int64_t remaining)

{
  wchar_t wVar1;
  sparse_block *psVar2;
  sparse_block *psVar3;
  
  psVar2 = (sparse_block *)calloc(1,0x20);
  if (psVar2 == (sparse_block *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    wVar1 = L'\xffffffe2';
  }
  else {
    psVar3 = (sparse_block *)&tar->sparse_list;
    if (tar->sparse_last != (sparse_block *)0x0) {
      psVar3 = tar->sparse_last;
    }
    psVar3->next = psVar2;
    tar->sparse_last = psVar2;
    psVar2->offset = offset;
    psVar2->remaining = remaining;
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
gnu_add_sparse_entry(struct archive_read *a, struct tar *tar,
    int64_t offset, int64_t remaining)
{
	struct sparse_block *p;

	p = (struct sparse_block *)malloc(sizeof(*p));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	memset(p, 0, sizeof(*p));
	if (tar->sparse_last != NULL)
		tar->sparse_last->next = p;
	else
		tar->sparse_list = p;
	tar->sparse_last = p;
	p->offset = offset;
	p->remaining = remaining;
	return (ARCHIVE_OK);
}